

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

void __thiscall DynamicHistogram<double>::~DynamicHistogram(DynamicHistogram<double> *this)

{
  DynamicHistogram<double> *this_local;
  
  ~DynamicHistogram(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

virtual
    ~DynamicHistogram()
    {
    }